

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O0

void __thiscall
io::
CSVReader<12u,io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>,io::throw_on_overflow,io::no_comment>
::set_column_names<char_const*,char_const*,char_const*,char_const*,char_const*>
          (CSVReader<12u,io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>,io::throw_on_overflow,io::no_comment>
           *this,string *s,char *cols,char *cols_1,char *cols_2,char *cols_3,char *cols_4)

{
  char *pcVar1;
  allocator local_59;
  string local_58 [32];
  char *local_38;
  char *cols_local_3;
  char *cols_local_2;
  char *cols_local_1;
  char *cols_local;
  string *s_local;
  CSVReader<12U,_io::trim_chars<___,___t_>,_io::no_quote_escape<_,_>,_io::throw_on_overflow,_io::no_comment>
  *this_local;
  
  local_38 = cols_3;
  cols_local_3 = cols_2;
  cols_local_2 = cols_1;
  cols_local_1 = cols;
  cols_local = (char *)s;
  s_local = (string *)this;
  std::__cxx11::string::operator=((string *)(this + 0x2f0),(string *)s);
  pcVar1 = cols_local_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar1,&local_59);
  set_column_names<char_const*,char_const*,char_const*,char_const*>
            (this,(string *)local_58,cols_local_2,cols_local_3,local_38,cols_4);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

void set_column_names(std::string s, ColNames...cols){
                        column_names[column_count-sizeof...(ColNames)-1] = std::move(s);
                        set_column_names(std::forward<ColNames>(cols)...);
                }